

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall QHeaderView::swapSections(QHeaderView *this,int first,int second)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ResizeMode RVar4;
  int visual;
  int iVar5;
  ResizeMode logicalIndex;
  int _t3;
  int iVar6;
  QHeaderViewPrivate *this_00;
  reference piVar7;
  int in_EDX;
  int in_ESI;
  QHeaderViewPrivate *in_RDI;
  int lastSectionVisualIdx;
  bool secondHidden;
  bool firstHidden;
  int secondLogical;
  ResizeMode secondMode;
  int secondSize;
  int firstLogical;
  ResizeMode firstMode;
  int firstSize;
  QHeaderViewPrivate *d;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar8;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int iVar9;
  
  this_00 = d_func((QHeaderView *)0x8369b4);
  if ((((in_ESI != in_EDX) &&
       (QAbstractItemViewPrivate::executePostedLayout
                  ((QAbstractItemViewPrivate *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)), -1 < in_ESI)) &&
      (iVar6 = in_ESI,
      iVar2 = QHeaderViewPrivate::sectionCount
                        ((QHeaderViewPrivate *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
      iVar6 < iVar2)) &&
     ((-1 < in_EDX &&
      (iVar2 = in_EDX,
      iVar3 = QHeaderViewPrivate::sectionCount
                        ((QHeaderViewPrivate *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
      iVar2 < iVar3)))) {
    bVar1 = QHeaderViewPrivate::noSectionMemoryUsage(this_00);
    if (bVar1) {
      QHeaderViewPrivate::switchToFlexibleModeWithSectionMemoryUsage((QHeaderViewPrivate *)0x836a37)
      ;
    }
    iVar3 = QHeaderViewPrivate::headerSectionSize
                      ((QHeaderViewPrivate *)CONCAT44(iVar6,iVar2),in_stack_ffffffffffffffb4);
    RVar4 = QHeaderViewPrivate::headerSectionResizeMode
                      ((QHeaderViewPrivate *)CONCAT44(iVar6,iVar2),in_stack_ffffffffffffffb4);
    visual = QHeaderViewPrivate::logicalIndex(in_RDI,iVar6);
    iVar5 = QHeaderViewPrivate::headerSectionSize
                      ((QHeaderViewPrivate *)CONCAT44(iVar6,iVar2),in_stack_ffffffffffffffb4);
    logicalIndex = QHeaderViewPrivate::headerSectionResizeMode
                             ((QHeaderViewPrivate *)CONCAT44(iVar6,iVar2),in_stack_ffffffffffffffb4)
    ;
    _t3 = QHeaderViewPrivate::logicalIndex(in_RDI,iVar6);
    if (this_00->state == ResizeSection) {
      this_00->preventCursorChangeInSetOffset = true;
    }
    QHeaderViewPrivate::createSectionItems
              ((QHeaderViewPrivate *)CONCAT44(logicalIndex,_t3),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20),(ResizeMode)in_RDI);
    QHeaderViewPrivate::createSectionItems
              ((QHeaderViewPrivate *)CONCAT44(logicalIndex,_t3),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20),(ResizeMode)in_RDI);
    QHeaderViewPrivate::initializeIndexMapping((QHeaderViewPrivate *)CONCAT44(iVar3,RVar4));
    iVar3 = in_EDX;
    piVar7 = QList<int>::operator[]
                       ((QList<int> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        CONCAT44(in_stack_ffffffffffffffac,in_EDX));
    *piVar7 = iVar3;
    iVar9 = visual;
    piVar7 = QList<int>::operator[]
                       ((QList<int> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        CONCAT44(visual,iVar3));
    *piVar7 = visual;
    iVar8 = in_ESI;
    piVar7 = QList<int>::operator[]
                       ((QList<int> *)CONCAT44(in_stack_ffffffffffffffb4,in_ESI),
                        CONCAT44(visual,iVar3));
    *piVar7 = iVar8;
    piVar7 = QList<int>::operator[]((QList<int> *)CONCAT44(_t3,iVar8),CONCAT44(visual,iVar3));
    *piVar7 = _t3;
    bVar1 = QHash<int,_int>::isEmpty(&this_00->hiddenSectionSize);
    if (!bVar1) {
      QHeaderViewPrivate::isVisualIndexHidden((QHeaderViewPrivate *)CONCAT44(_t3,iVar8),visual);
      QHeaderViewPrivate::isVisualIndexHidden((QHeaderViewPrivate *)CONCAT44(_t3,iVar8),visual);
      QHeaderViewPrivate::setVisualIndexHidden
                ((QHeaderViewPrivate *)CONCAT44(_t3,iVar8),visual,SUB41((uint)iVar3 >> 0x18,0));
      QHeaderViewPrivate::setVisualIndexHidden
                ((QHeaderViewPrivate *)CONCAT44(_t3,iVar8),visual,SUB41((uint)iVar3 >> 0x18,0));
    }
    QWidget::update((QWidget *)CONCAT44(visual,iVar3));
    sectionMoved((QHeaderView *)CONCAT44(visual,iVar3),iVar6,iVar2,_t3);
    sectionMoved((QHeaderView *)CONCAT44(visual,iVar3),iVar6,iVar2,_t3);
    bVar1 = stretchLastSection((QHeaderView *)CONCAT44(_t3,iVar8));
    if ((bVar1) &&
       ((iVar6 = visualIndex((QHeaderView *)CONCAT44(iVar9,iVar5),logicalIndex), iVar6 <= in_ESI ||
        (iVar6 <= in_EDX)))) {
      QHeaderViewPrivate::maybeRestorePrevLastSectionAndStretchLast(in_RDI);
    }
  }
  return;
}

Assistant:

void QHeaderView::swapSections(int first, int second)
{
    Q_D(QHeaderView);

    if (first == second)
        return;
    d->executePostedLayout();
    if (first < 0 || first >= d->sectionCount() || second < 0 || second >= d->sectionCount())
        return;

    if (d->noSectionMemoryUsage())
        d->switchToFlexibleModeWithSectionMemoryUsage();

    int firstSize = d->headerSectionSize(first);
    ResizeMode firstMode = d->headerSectionResizeMode(first);
    int firstLogical = d->logicalIndex(first);

    int secondSize = d->headerSectionSize(second);
    ResizeMode secondMode = d->headerSectionResizeMode(second);
    int secondLogical = d->logicalIndex(second);

    if (d->state == QHeaderViewPrivate::ResizeSection)
        d->preventCursorChangeInSetOffset = true;

    d->createSectionItems(second, second, firstSize, firstMode);
    d->createSectionItems(first, first, secondSize, secondMode);

    d->initializeIndexMapping();

    d->visualIndices[firstLogical] = second;
    d->logicalIndices[second] = firstLogical;

    d->visualIndices[secondLogical] = first;
    d->logicalIndices[first] = secondLogical;

    if (!d->hiddenSectionSize.isEmpty()) {
        bool firstHidden = d->isVisualIndexHidden(first);
        bool secondHidden = d->isVisualIndexHidden(second);
        d->setVisualIndexHidden(first, secondHidden);
        d->setVisualIndexHidden(second, firstHidden);
    }

    d->viewport->update();
    emit sectionMoved(firstLogical, first, second);
    emit sectionMoved(secondLogical, second, first);

    if (stretchLastSection()) {
        const int lastSectionVisualIdx = visualIndex(d->lastSectionLogicalIdx);
        if (first >= lastSectionVisualIdx || second >= lastSectionVisualIdx)
            d->maybeRestorePrevLastSectionAndStretchLast();
    }
}